

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetRuntime(JsContextRef context,JsRuntimeHandle *runtime)

{
  bool bVar1;
  JsrtRuntime *pJVar2;
  JsRuntimeHandle *runtime_local;
  JsContextRef context_local;
  
  if (context == (JsContextRef)0x0) {
    context_local._4_4_ = JsErrorInvalidArgument;
  }
  else if (runtime == (JsRuntimeHandle *)0x0) {
    context_local._4_4_ = JsErrorNullArgument;
  }
  else {
    *runtime = (JsRuntimeHandle)0x0;
    bVar1 = JsrtContext::Is(context);
    if (bVar1) {
      pJVar2 = JsrtContext::GetRuntime((JsrtContext *)context);
      *runtime = pJVar2;
      context_local._4_4_ = JsNoError;
    }
    else {
      context_local._4_4_ = JsErrorInvalidArgument;
    }
  }
  return context_local._4_4_;
}

Assistant:

CHAKRA_API JsGetRuntime(_In_ JsContextRef context, _Out_ JsRuntimeHandle *runtime)
{
    VALIDATE_JSREF(context);
    PARAM_NOT_NULL(runtime);

    *runtime = nullptr;

    if (!JsrtContext::Is(context))
    {
        return JsErrorInvalidArgument;
    }

    *runtime = static_cast<JsrtContext *>(context)->GetRuntime();
    return JsNoError;
}